

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamtests.cc
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  int argc_local;
  stat info;
  
  argc_local = argc;
  testing::InitGoogleTest(&argc_local,argv);
  if (testing::FLAGS_gtest_list_tests == '\0') {
    if (argc_local != 2) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Usage: ");
      poVar2 = std::operator<<(poVar2,*argv);
      std::operator<<(poVar2," <test images path>\n");
      return -1;
    }
    std::__cxx11::string::assign((char *)&(anonymous_namespace)::testImagesPath_abi_cxx11_);
    iVar1 = stat((anonymous_namespace)::testImagesPath_abi_cxx11_,(stat *)&info);
    if (iVar1 != 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Cannot access ");
      poVar2 = std::operator<<(poVar2,(string *)&(anonymous_namespace)::testImagesPath_abi_cxx11_);
      std::operator<<(poVar2,'\n');
      return -2;
    }
    if ((info.st_mode._1_1_ & 0x40) == 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,
                               (string *)&(anonymous_namespace)::testImagesPath_abi_cxx11_);
      std::operator<<(poVar2,"is not a valid directory\n");
      return -3;
    }
  }
  iVar1 = RUN_ALL_TESTS();
  return iVar1;
}

Assistant:

int main(int argc, char **argv)
{
    ::testing::InitGoogleTest(&argc, argv);

    if (!::testing::FLAGS_gtest_list_tests)
    {
        if (argc != 2)
        {
            std::cerr << "Usage: " << argv[0] << " <test images path>\n";
            return -1;
        }

        testImagesPath = argv[1];

        struct stat info;
        if (stat(testImagesPath.data(), &info) != 0)
        {
            std::cerr << "Cannot access " << testImagesPath << '\n';
            return -2;
        }
        else if (!(info.st_mode & S_IFDIR))
        {
            std::cerr << testImagesPath << "is not a valid directory\n";
            return -3;
        }
    }

    return RUN_ALL_TESTS();
}